

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::AddSourceCommon(cmGeneratorTarget *this,string *src,bool before)

{
  const_iterator __position;
  pointer pcVar1;
  TargetPropertyEntryVector *pTVar2;
  cmake *propertyValue;
  undefined7 in_register_00000011;
  undefined1 local_a0 [8];
  _Rb_tree_node_base *local_98;
  _Base_ptr local_90;
  _Rb_tree_node_base local_88;
  _Rb_tree_node_base *local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr p_Stack_48;
  _Alloc_hider local_40;
  _Base_ptr p_Stack_38;
  
  pTVar2 = (TargetPropertyEntryVector *)
           &(this->SourceEntries).
            super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((int)CONCAT71(in_register_00000011,before) != 0) {
    pTVar2 = &this->SourceEntries;
  }
  __position._M_current =
       (pTVar2->
       super__Vector_base<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  propertyValue = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
  pcVar1 = (src->_M_dataplus)._M_p;
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + src->_M_string_length);
  cmMakefile::GetBacktrace(this->Makefile);
  if (local_98 == &local_88) {
    p_Stack_48 = local_88._M_parent;
    local_60 = (_Rb_tree_node_base *)&local_50;
  }
  else {
    local_60 = local_98;
  }
  local_50 = (_Base_ptr)CONCAT71(local_88._1_7_,(undefined1)local_88._M_color);
  local_58 = local_90;
  local_90 = (_Base_ptr)0x0;
  local_88._M_color._0_1_ = _S_red;
  local_40._M_p = (pointer)local_88._M_left;
  p_Stack_38 = local_88._M_right;
  local_88._M_left = (_Base_ptr)0x0;
  local_88._M_right = (_Base_ptr)0x0;
  local_98 = &local_88;
  CreateTargetPropertyEntry
            ((cmake *)local_a0,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )propertyValue,SUB81(&local_60,0));
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::_M_insert_rval(&this->SourceEntries,__position,(value_type *)local_a0);
  if (local_a0 != (undefined1  [8])0x0) {
    (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                 *)local_a0)->
              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
              )._M_t.
              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
              _vptr_cmGlobalGeneratorFactory)();
  }
  local_a0 = (undefined1  [8])0x0;
  if (p_Stack_38 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_38);
  }
  if (local_60 != (_Rb_tree_node_base *)&local_50) {
    operator_delete(local_60,(ulong)((long)&local_50->_M_color + 1));
  }
  if (local_88._M_right != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_right);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(local_88._1_7_,(undefined1)local_88._M_color) + 1);
  }
  ClearSourcesCache(this);
  return;
}

Assistant:

void cmGeneratorTarget::AddSourceCommon(const std::string& src, bool before)
{
  this->SourceEntries.insert(
    before ? this->SourceEntries.begin() : this->SourceEntries.end(),
    CreateTargetPropertyEntry(
      *this->LocalGenerator->GetCMakeInstance(),
      BT<std::string>(src, this->Makefile->GetBacktrace()), true));
  this->ClearSourcesCache();
}